

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satProof2.h
# Opt level: O2

void Prf_ManStopP(Prf_Man_t **p)

{
  Prf_Man_t *__ptr;
  
  __ptr = *p;
  if (__ptr != (Prf_Man_t *)0x0) {
    Vec_IntFree(__ptr->vSaved);
    Vec_WrdFree(__ptr->vInfo);
    free(__ptr);
  }
  *p = (Prf_Man_t *)0x0;
  return;
}

Assistant:

static inline void Prf_ManStopP( Prf_Man_t ** p )
{
    Prf_ManStop( *p );
    *p = NULL;
}